

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string cs_impl::to_string<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(array *arr)

{
  bool bVar1;
  undefined8 in_RSI;
  proxy *in_RDI;
  var *it;
  const_iterator __end1;
  const_iterator __begin1;
  array *__range1;
  string str;
  _Self *in_stack_fffffffffffffef8;
  undefined1 *puVar2;
  _Self *__x;
  any *in_stack_ffffffffffffff08;
  allocator *paVar3;
  string local_e0 [8];
  any *in_stack_ffffffffffffff28;
  string local_c0 [32];
  reference local_a0;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_78;
  undefined8 local_58;
  undefined1 local_49 [56];
  allocator local_11;
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::empty
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x2db6e1);
  if (bVar1) {
    paVar3 = &local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"{}",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    __x = (_Self *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_49 + 1),"{",(allocator *)__x);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
    local_58 = local_10;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffef8);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffef8);
    while( true ) {
      bVar1 = std::operator!=(__x,in_stack_fffffffffffffef8);
      if (!bVar1) break;
      local_a0 = std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::
                 operator*(&local_78);
      any::to_string_abi_cxx11_(in_stack_ffffffffffffff28);
      std::operator+(in_stack_ffffffffffffff08,(char *)__x);
      std::__cxx11::string::operator+=((string *)(local_49 + 1),local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::operator++
                (__x);
    }
    puVar2 = local_49 + 1;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)puVar2);
    std::__cxx11::string::operator+=((string *)(local_49 + 1),"}");
    std::__cxx11::string::string((string *)in_RDI,(string *)(local_49 + 1));
    std::__cxx11::string::~string((string *)(local_49 + 1));
  }
  return (string)in_RDI;
}

Assistant:

std::string to_string<cs::array>(const cs::array &arr)
	{
		if (arr.empty())
			return "{}";
		std::string str = "{";
		for (const cs::var &it: arr)
			str += it.to_string() + ", ";
		str.resize(str.size() - 2);
		str += "}";
		return std::move(str);
	}